

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmach.c
# Opt level: O3

double dmach(char *cmach)

{
  undefined2 in_FPUControlWord;
  double dVar1;
  int local_10 [2];
  int argument;
  
  switch(*cmach) {
  case 'B':
    dVar1 = 2.0;
    break;
  default:
    local_10[0] = 0;
    input_error("dmach",local_10);
    dVar1 = 0.0;
    break;
  case 'E':
    dVar1 = 1.1102230246251565e-16;
    break;
  case 'L':
    dVar1 = 1024.0;
    break;
  case 'M':
    dVar1 = -1021.0;
    break;
  case 'N':
    dVar1 = 53.0;
    break;
  case 'O':
    dVar1 = 1.79769313486232e+308;
    break;
  case 'P':
    dVar1 = 2.220446049250313e-16;
    break;
  case 'R':
    dVar1 = (double)(0x2dU >> ((byte)((ushort)in_FPUControlWord >> 9) & 6) & 3);
    break;
  case 'S':
  case 'U':
    dVar1 = 2.2250738585072014e-308;
  }
  return dVar1;
}

Assistant:

double dmach(char *cmach)
{
/*  -- SuperLU auxiliary routine (version 5.0) --   
    This uses C99 standard constants, and is thread safe.

    Must be compiled with -std=c99 flag.


    Purpose   
    =======   

    DMACH returns double precision machine parameters.   

    Arguments   
    =========   

    CMACH   (input) CHARACTER*1   
            Specifies the value to be returned by DMACH:   
            = 'E' or 'e',   DMACH := eps   
            = 'S' or 's ,   DMACH := sfmin   
            = 'B' or 'b',   DMACH := base   
            = 'P' or 'p',   DMACH := eps*base   
            = 'N' or 'n',   DMACH := t   
            = 'R' or 'r',   DMACH := rnd   
            = 'M' or 'm',   DMACH := emin   
            = 'U' or 'u',   DMACH := rmin   
            = 'L' or 'l',   DMACH := emax   
            = 'O' or 'o',   DMACH := rmax   

            where   

            eps   = relative machine precision   
            sfmin = safe minimum, such that 1/sfmin does not overflow   
            base  = base of the machine   
            prec  = eps*base   
            t     = number of (base) digits in the mantissa   
            rnd   = 1.0 when rounding occurs in addition, 0.0 otherwise   
            emin  = minimum exponent before (gradual) underflow   
            rmin  = underflow threshold - base**(emin-1)   
            emax  = largest exponent before overflow   
            rmax  = overflow threshold  - (base**emax)*(1-eps)   

   ===================================================================== 
*/

    double sfmin, small, rmach;

    if (strncmp(cmach, "E", 1)==0) {
	rmach = DBL_EPSILON * 0.5;
    } else if (strncmp(cmach, "S", 1)==0) {
	sfmin = DBL_MIN;
	small = 1. / DBL_MAX;
	if (small >= sfmin) {
	    /* Use SMALL plus a bit, to avoid the possibility of rounding   
	       causing overflow when computing  1/sfmin. */
	    sfmin = small * (DBL_EPSILON*0.5 + 1.);
	}
	rmach = sfmin;
    } else if (strncmp(cmach, "B", 1)==0) {
	rmach = FLT_RADIX;
    } else if (strncmp(cmach, "P", 1)==0) {
	rmach = DBL_EPSILON * 0.5 * FLT_RADIX;
    } else if (strncmp(cmach, "N", 1)==0) {
	rmach = DBL_MANT_DIG;
    } else if (strncmp(cmach, "R", 1)==0) {
	rmach = FLT_ROUNDS;
    } else if (strncmp(cmach, "M", 1)==0) {
	rmach = DBL_MIN_EXP;
    } else if (strncmp(cmach, "U", 1)==0) {
	rmach = DBL_MIN;
    } else if (strncmp(cmach, "L", 1)==0) {
	rmach = DBL_MAX_EXP;
    } else if (strncmp(cmach, "O", 1)==0) {
	rmach = DBL_MAX;
    } else {
        int argument = 0;
        input_error("dmach", &argument);
        rmach = 0;
    }

    return rmach;

}